

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasStringPieceFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  bool bVar2;
  CType CVar3;
  FieldDescriptor *field;
  Descriptor *descriptor_00;
  int i;
  int iVar4;
  Options *options_00;
  int i_1;
  uint index;
  
  iVar4 = 0;
  while( true ) {
    if (*(int *)(descriptor + 4) <= iVar4) {
      index = 0;
      do {
        iVar4 = *(int *)(descriptor + 0x80);
        bVar1 = (int)index < iVar4;
        if (iVar4 <= (int)index) {
          return bVar1;
        }
        options_00 = (Options *)(ulong)index;
        descriptor_00 = Descriptor::nested_type(descriptor,index);
        bVar2 = HasStringPieceFields(descriptor_00,options_00);
        index = index + 1;
      } while (!bVar2);
      return bVar1;
    }
    field = Descriptor::field(descriptor,iVar4);
    if ((*(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 9) &&
       (CVar3 = protobuf::internal::cpp::
                EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                          (field), CVar3 == FieldOptions_CType_STRING_PIECE)) break;
    iVar4 = iVar4 + 1;
  }
  return true;
}

Assistant:

static bool HasStringPieceFields(const Descriptor* descriptor,
                                 const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsStringPieceField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasStringPieceFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}